

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_proj.c
# Opt level: O0

void PDHG_Restart_Iterate_GPU(CUPDLPwork *pdhg)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 *puVar5;
  cupdlp_float *pcVar6;
  cupdlp_float *pcVar7;
  CUPDLPproblem *pCVar8;
  CUPDLPresobj *pCVar9;
  PDHG_restart_choice PVar10;
  long *in_RDI;
  CUPDLPwork *unaff_retaddr;
  CUPDLPwork *in_stack_00000018;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  PDHG_restart_choice restart_choice;
  CUPDLPtimers *timers;
  CUPDLPresobj *resobj;
  CUPDLPstepsize *stepsize;
  CUPDLPiterates *iterates;
  CUPDLPproblem *problem;
  CUPDLPwork *work;
  
  lVar2 = *in_RDI;
  work = (CUPDLPwork *)in_RDI[3];
  lVar3 = in_RDI[4];
  lVar4 = in_RDI[2];
  puVar5 = (undefined4 *)in_RDI[6];
  PVar10 = PDHG_Check_Restart_GPU(work);
  if (PVar10 != PDHG_NO_RESTART) {
    iVar1 = *(int *)in_RDI[6];
    pcVar6 = (&work->buffer2)[iVar1 % 2];
    pcVar7 = (&work->rowScale)[iVar1 % 2];
    pCVar8 = (&work[1].problem)[iVar1 % 2];
    pCVar9 = (&work[1].resobj)[iVar1 % 2];
    *(undefined8 *)(lVar3 + 0x18) = 0;
    *(undefined8 *)(lVar3 + 0x20) = 0;
    memset(work->stepsize,0,(long)*(int *)(lVar2 + 0x44) << 3);
    memset(work->scaling,0,(long)*(int *)(lVar2 + 0x40) << 3);
    if (PVar10 == PDHG_RESTART_TO_AVERAGE) {
      *(undefined8 *)(lVar4 + 0x150) = *(undefined8 *)(lVar4 + 0x128);
      *(undefined8 *)(lVar4 + 0x158) = *(undefined8 *)(lVar4 + 0x130);
      *(undefined8 *)(lVar4 + 0x160) = *(undefined8 *)(lVar4 + 0x118);
      memcpy((void *)pcVar6[1],(void *)(work[1].stepsize)->dPrimalStep,
             (long)*(int *)(lVar2 + 0x44) << 3);
      memcpy((void *)pcVar7[1],(work[1].scaling)->rowScale,(long)*(int *)(lVar2 + 0x40) << 3);
      memcpy(pCVar8->lower,(void *)(work[1].timers)->dSolvingTime,(long)*(int *)(lVar2 + 0x40) << 3)
      ;
      memcpy((void *)pCVar9->dPrimalObj,(work[1].buffer)->data,(long)*(int *)(lVar2 + 0x44) << 3);
    }
    else {
      *(undefined8 *)(lVar4 + 0x150) = *(undefined8 *)(lVar4 + 0x28);
      *(undefined8 *)(lVar4 + 0x158) = *(undefined8 *)(lVar4 + 0x30);
      *(undefined8 *)(lVar4 + 0x160) = *(undefined8 *)(lVar4 + 0x18);
    }
    PDHG_Compute_Step_Size_Ratio(unaff_retaddr);
    memcpy(work->timers,(void *)pcVar6[1],(long)*(int *)(lVar2 + 0x44) << 3);
    memcpy(work->buffer,(void *)pcVar7[1],(long)*(int *)(lVar2 + 0x40) << 3);
    *(undefined4 *)&work->settings = *puVar5;
    PDHG_Compute_Residuals(in_stack_00000018);
  }
  return;
}

Assistant:

void PDHG_Restart_Iterate_GPU(CUPDLPwork *pdhg) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPtimers *timers = pdhg->timers;

  // PDHG_Compute_Average_Iterate(pdhg);
  PDHG_restart_choice restart_choice = PDHG_Check_Restart_GPU(pdhg);

  if (restart_choice == PDHG_NO_RESTART) return;

  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  stepsize->dSumPrimalStep = 0.0;
  stepsize->dSumDualStep = 0.0;
  CUPDLP_ZERO_VEC(iterates->xSum, cupdlp_float, problem->nCols);
  CUPDLP_ZERO_VEC(iterates->ySum, cupdlp_float, problem->nRows);

  if (restart_choice == PDHG_RESTART_TO_AVERAGE) {
    resobj->dPrimalFeasLastRestart = resobj->dPrimalFeasAverage;
    resobj->dDualFeasLastRestart = resobj->dDualFeasAverage;
    resobj->dDualityGapLastRestart = resobj->dDualityGapAverage;

    // cupdlp_copy(iterates->x, iterates->xAverage, cupdlp_float,
    // problem->nCols); cupdlp_copy(iterates->y, iterates->yAverage,
    // cupdlp_float, problem->nRows); cupdlp_copy(iterates->ax,
    // iterates->axAverage, cupdlp_float, problem->nRows);
    // cupdlp_copy(iterates->aty, iterates->atyAverage, cupdlp_float,
    // problem->nCols);

    CUPDLP_COPY_VEC(x->data, iterates->xAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(y->data, iterates->yAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(ax->data, iterates->axAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(aty->data, iterates->atyAverage->data, cupdlp_float, problem->nCols);

  } else {
    resobj->dPrimalFeasLastRestart = resobj->dPrimalFeas;
    resobj->dDualFeasLastRestart = resobj->dDualFeas;
    resobj->dDualityGapLastRestart = resobj->dDualityGap;
  }

  PDHG_Compute_Step_Size_Ratio(pdhg);

  // cupdlp_copy(iterates->xLastRestart, iterates->x, cupdlp_float,
  // problem->nCols); cupdlp_copy(iterates->yLastRestart, iterates->y,
  // cupdlp_float, problem->nRows);

  CUPDLP_COPY_VEC(iterates->xLastRestart, x->data, cupdlp_float, problem->nCols);
  CUPDLP_COPY_VEC(iterates->yLastRestart, y->data, cupdlp_float, problem->nRows);

  iterates->iLastRestartIter = timers->nIter;

  PDHG_Compute_Residuals(pdhg);
  // cupdlp_printf("Recomputed stepsize ratio: %e,  sqrt(ratio)=%e",
  // stepsize->dBeta, sqrt(stepsize->dBeta));
}